

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteCollectionCacheRemoveRecord(unqlite_col *pCol,jx9_int64 nId)

{
  unqlite_col_record *puVar1;
  sxu32 sVar2;
  unqlite_col_record *puVar3;
  
  sVar2 = pCol->nRec;
  if (sVar2 != 0) {
    for (puVar3 = pCol->apRecord[(uint)nId & pCol->nRecSize - 1];
        puVar3 != (unqlite_col_record *)0x0; puVar3 = puVar3->pNextCol) {
      if (puVar3->nId == nId) goto LAB_0011c857;
    }
  }
  puVar3 = (unqlite_col_record *)0x0;
LAB_0011c857:
  if (puVar3 != (unqlite_col_record *)0x0) {
    if (puVar3->pPrevCol == (unqlite_col_record *)0x0) {
      pCol->apRecord[(uint)nId & pCol->nRecSize - 1] = puVar3->pNextCol;
    }
    else {
      puVar3->pPrevCol->pNextCol = puVar3->pNextCol;
    }
    if (puVar3->pNextCol != (unqlite_col_record *)0x0) {
      puVar3->pNextCol->pPrevCol = puVar3->pPrevCol;
    }
    if (pCol->pList == puVar3) {
      pCol->pList = pCol->pList->pNext;
    }
    puVar1 = puVar3->pPrev;
    if (puVar1 != (unqlite_col_record *)0x0) {
      puVar1->pNext = puVar3->pNext;
    }
    if (puVar3->pNext != (unqlite_col_record *)0x0) {
      puVar3->pNext->pPrev = puVar1;
    }
    sVar2 = sVar2 - 1;
    pCol->nRec = sVar2;
  }
  return sVar2;
}

Assistant:

UNQLITE_PRIVATE int unqliteCollectionCacheRemoveRecord(
	unqlite_col *pCol, /* Target collection */
	jx9_int64 nId      /* Unique record ID */
	)
{
	unqlite_col_record *pRecord;
	/* Fetch the record first */
	pRecord = CollectionCacheFetchRecord(pCol,nId);
	if( pRecord == 0 ){
		/* No such record */
		return UNQLITE_NOTFOUND;
	}
	if( pRecord->pPrevCol ){
		pRecord->pPrevCol->pNextCol = pRecord->pNextCol;
	}else{
		sxu32 iBucket = COL_RECORD_HASH(nId) & (pCol->nRecSize - 1);
		pCol->apRecord[iBucket] = pRecord->pNextCol;
	}
	if( pRecord->pNextCol ){
		pRecord->pNextCol->pPrevCol = pRecord->pPrevCol;
	}
	/* Unlink */
	MACRO_LD_REMOVE(pCol->pList,pRecord);
	pCol->nRec--;
	return UNQLITE_OK;
}